

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O2

void predict_or_learn_active_cover<true>(active_cover *a,single_learner *base,example *ec)

{
  size_t i;
  float prediction;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vw *all;
  bool in_dis;
  ulong uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  float local_88;
  
  LEARNER::learner<char,_example>::predict(base,ec,0);
  all = a->all;
  fVar13 = (float)all->sd->t;
  fVar14 = (ec->l).simple.label;
  prediction = (ec->pred).scalar;
  fVar1 = ec->weight;
  fVar7 = get_threshold((float)all->sd->sum_loss,fVar13,a->active_c0,a->alpha);
  in_dis = dis_test(all,ec,base,fVar7,fVar7);
  fVar8 = get_pmin((float)all->sd->sum_loss,fVar13);
  fVar9 = query_decision(a,base,ec,prediction,fVar8,in_dis);
  if (in_dis) {
    if (fVar9 <= 0.0) {
      (ec->l).multi.label = 0x7f7fffff;
      ec->weight = 0.0;
      goto LAB_002000d4;
    }
    all->sd->queries = all->sd->queries + 1;
    ec->weight = fVar1 * fVar9;
    (ec->l).simple.label = fVar14;
  }
  else {
    (ec->l).simple.label = *(float *)(&DAT_0026e270 + (ulong)(0.0 < prediction) * 4);
    ec->weight = fVar1;
  }
  LEARNER::learner<char,_example>::learn(base,ec,0);
LAB_002000d4:
  fVar7 = (((fVar7 + fVar7) * fVar13 * a->alpha) / a->active_c0) / a->beta_scale;
  if (in_dis) {
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
    local_88 = 0.0;
    uVar6 = -(uint)(0.0 < fVar14);
    fVar14 = (float)(-(uint)((float)(~uVar6 & 0xbf800000 | uVar6 & 0x3f800000) !=
                            (float)(~-(uint)(0.0 < prediction) & 0xbf800000 |
                                   -(uint)(0.0 < prediction) & 0x3f800000)) & 0x3f800000) *
             fVar9 * fVar7;
  }
  else {
    local_88 = -fVar7;
    fVar14 = 0.0;
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
  }
  fVar8 = fVar8 * fVar8 * 4.0;
  fVar13 = (ec->l).simple.label;
  fVar2 = ec->weight;
  fVar3 = *(float *)(&DAT_0026e270 + (ulong)(0.0 < prediction) * 4);
  uVar5 = 0;
  while (uVar5 < a->cover_size) {
    if (in_dis) {
      fVar10 = SQRT(fVar8);
      fVar11 = fVar10;
      if (fVar8 < 0.0) {
        fVar11 = sqrtf(fVar8);
        fVar10 = sqrtf(fVar8);
      }
      fVar4 = a->alpha;
      local_88 = (fVar14 + fVar14 + -fVar7 * fVar9) -
                 ((fVar4 + fVar4) * fVar4 + -1.0 / (fVar11 / (fVar10 + 1.0)));
    }
    (ec->l).multi.label =
         ~-(uint)(0.0 < local_88) & (uint)fVar3 | -(uint)(0.0 < local_88) & (uint)-fVar3;
    ec->weight = ABS(local_88) * fVar1;
    i = uVar5 + 1;
    LEARNER::learner<char,_example>::learn(base,ec,i);
    LEARNER::learner<char,_example>::predict(base,ec,i);
    uVar6 = -(uint)(0.0 < (ec->pred).scalar);
    fVar11 = (float)(-(uint)((float)(~uVar6 & 0xbf800000 | uVar6 & 0x3f800000) != fVar3) &
                    0x3f800000);
    a->lambda_n[uVar5] = (fVar11 + fVar11) * local_88 + a->lambda_n[uVar5];
    fVar11 = a->lambda_n[uVar5];
    if (fVar11 <= 0.0) {
      fVar11 = 0.0;
    }
    a->lambda_n[uVar5] = fVar11;
    uVar6 = -(uint)(0.0 < (ec->pred).scalar);
    dVar12 = pow((double)fVar8,1.5);
    a->lambda_d[uVar5] =
         (float)((float)(~uVar6 & 0xbf800000 | uVar6 & 0x3f800000) != fVar3 && in_dis) /
         (float)dVar12 + a->lambda_d[uVar5];
    uVar6 = -(uint)(0.0 < (ec->pred).scalar);
    fVar8 = fVar8 + (a->lambda_n[uVar5] / a->lambda_d[uVar5]) *
                    (float)(-(uint)((float)(~uVar6 & 0xbf800000 | uVar6 & 0x3f800000) != fVar3) &
                           0x3f800000);
    uVar5 = i;
  }
  ec->weight = fVar2;
  (ec->l).simple.label = fVar13;
  (ec->pred).scalar = prediction;
  return;
}

Assistant:

void predict_or_learn_active_cover(active_cover& a, single_learner& base, example& ec)
{
  base.predict(ec, 0);

  if (is_learn)
  {
    vw& all = *a.all;

    float prediction = ec.pred.scalar;
    float t = (float)a.all->sd->t;
    float ec_input_weight = ec.weight;
    float ec_input_label = ec.l.simple.label;

    // Compute threshold defining allowed set A
    float threshold = get_threshold((float)all.sd->sum_loss, t, a.active_c0, a.alpha);
    bool in_dis = dis_test(all, ec, base, prediction, threshold);
    float pmin = get_pmin((float)all.sd->sum_loss, t);
    float importance = query_decision(a, base, ec, prediction, pmin, in_dis);

    // Query (or not)
    if (!in_dis)  // Use predicted label
    {
      ec.l.simple.label = sign(prediction);
      ec.weight = ec_input_weight;
      base.learn(ec, 0);
    }
    else if (importance > 0)  // Use importance-weighted example
    {
      all.sd->queries += 1;
      ec.weight = ec_input_weight * importance;
      ec.l.simple.label = ec_input_label;
      base.learn(ec, 0);
    }
    else  // skipped example
    {
      // Make sure the loss computation does not include
      // skipped examples
      ec.l.simple.label = FLT_MAX;
      ec.weight = 0;
    }

    // Update the learners in the cover and their weights
    float q2 = 4.f * pmin * pmin;
    float p, s, cost, cost_delta = 0;
    float ec_output_label = ec.l.simple.label;
    float ec_output_weight = ec.weight;
    float r = 2.f * threshold * t * a.alpha / a.active_c0 / a.beta_scale;

    // Set up costs
    // cost = cost of predicting erm's prediction
    // cost_delta = cost - cost of predicting the opposite label
    if (in_dis)
    {
      cost = r * (fmax(importance, 0.f)) * ((float)(sign(prediction) != sign(ec_input_label)));
    }
    else
    {
      cost = 0.f;
      cost_delta = -r;
    }

    for (size_t i = 0; i < a.cover_size; i++)
    {
      // Update cost
      if (in_dis)
      {
        p = sqrt(q2) / (1.f + sqrt(q2));
        s = 2.f * a.alpha * a.alpha - 1.f / p;
        cost_delta = 2.f * cost - r * (fmax(importance, 0.f)) - s;
      }

      // Choose min-cost label as the label
      // Set importance weight to be the cost difference
      ec.l.simple.label = -1.f * sign(cost_delta) * sign(prediction);
      ec.weight = ec_input_weight * fabs(cost_delta);

      // Update learner
      base.learn(ec, i + 1);
      base.predict(ec, i + 1);

      // Update numerator of lambda
      a.lambda_n[i] += 2.f * ((float)(sign(ec.pred.scalar) != sign(prediction))) * cost_delta;
      a.lambda_n[i] = fmax(a.lambda_n[i], 0.f);

      // Update denominator of lambda
      a.lambda_d[i] += ((float)(sign(ec.pred.scalar) != sign(prediction) && in_dis)) / (float)pow(q2, 1.5);

      // Accumulating weights of learners in the cover
      q2 += ((float)(sign(ec.pred.scalar) != sign(prediction))) * (a.lambda_n[i] / a.lambda_d[i]);
    }

    // Restoring the weight, the label, and the prediction
    ec.weight = ec_output_weight;
    ec.l.simple.label = ec_output_label;
    ec.pred.scalar = prediction;
  }
}